

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O3

bool __thiscall
sisl::sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_>::dump_to_stream
          (sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_> *this,ofstream *stream)

{
  int iVar1;
  _Hash_node_base *p_Var2;
  uint val;
  int key;
  uint sig;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  iVar1 = *(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
  if (iVar1 == 0) {
    local_2c = 0x53534c53;
    std::ostream::write((char *)stream,(long)&local_2c);
    std::ostream::write((char *)stream,(long)this->_dims);
    local_30 = (undefined4)(this->siteMap)._M_h._M_element_count;
    std::ostream::write((char *)stream,(long)&local_30);
    p_Var2 = (this->siteMap)._M_h._M_before_begin._M_nxt;
    if (p_Var2 != (_Hash_node_base *)0x0) {
      do {
        local_34 = *(undefined4 *)&p_Var2[1]._M_nxt;
        local_38 = *(undefined4 *)((long)&p_Var2[1]._M_nxt + 4);
        std::ostream::write((char *)stream,(long)&local_34);
        std::ostream::write((char *)stream,(long)&local_38);
        p_Var2 = p_Var2->_M_nxt;
      } while (p_Var2 != (_Hash_node_base *)0x0);
    }
  }
  return iVar1 == 0;
}

Assistant:

bool dump_to_stream(std::ofstream &stream) const {
            if(!stream.good()) return false;

            unsigned int sig = 0x53534c53;

            unsigned int size = 1;
            for(int i = 0; i < N; i++) {
                size *= _dims[i];
            }

            stream.write((const char *)&sig, sizeof(unsigned int));
            stream.write((const char *)&_dims[0], N*sizeof(unsigned int));

            size = siteMap.size();
            stream.write((const char *)&size, sizeof(unsigned int));

            for(auto it = siteMap.begin(); it != siteMap.end(); ++it) {
                int key = it->first;
                T val = it->second;

                stream.write((const char *)&key, sizeof(unsigned int));
                stream.write((const char *)&val, sizeof(T));
            }

            return true;
        }